

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O0

void __thiscall
HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_OperatorEquals_Test<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  bool bVar1;
  key_type kVar2;
  Type type;
  key_type kVar3;
  char *file;
  uint *lhs;
  AssertHelper *this_00;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  TypeParam ht2_2;
  TypeParam ht1_2;
  AssertionResult gtest_ar;
  TypeParam ht2_1;
  TypeParam ht1_1;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  TypeParam ht2;
  TypeParam ht1;
  undefined4 in_stack_fffffffffffff928;
  int in_stack_fffffffffffff92c;
  HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff930;
  uint *in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff940;
  undefined4 in_stack_fffffffffffff944;
  key_equal *in_stack_fffffffffffff948;
  int line;
  hasher *in_stack_fffffffffffff950;
  undefined4 in_stack_fffffffffffff958;
  Type in_stack_fffffffffffff95c;
  undefined4 in_stack_fffffffffffff960;
  undefined4 in_stack_fffffffffffff964;
  char *in_stack_fffffffffffff990;
  undefined4 in_stack_fffffffffffff998;
  undefined4 in_stack_fffffffffffff99c;
  uint uVar4;
  char *in_stack_fffffffffffff9a0;
  AssertionResult *in_stack_fffffffffffff9a8;
  Hasher *this_01;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *in_stack_fffffffffffff9b0;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  *this_02;
  AssertionResult local_5d0 [2];
  char *local_5b0;
  undefined4 local_5a4;
  AssertionResult local_5a0 [3];
  Type local_568;
  key_type local_564;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_560;
  Hasher local_550;
  Hasher local_544 [11];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_4b8;
  Hasher local_4a8;
  Hasher local_49c [13];
  size_type local_400;
  undefined4 local_3f4;
  AssertionResult local_3f0 [3];
  value_type local_3b4;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_3b0;
  Hasher local_3a0;
  Hasher local_394 [11];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_308;
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  local_2f8;
  string local_260 [55];
  undefined1 local_229;
  AssertionResult local_228;
  string local_218 [55];
  byte local_1e1;
  AssertionResult local_1e0 [3];
  value_type local_1a4;
  value_type local_174;
  key_type local_170;
  key_type local_16c;
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_168;
  Hasher local_158;
  Hasher local_14c [13];
  Alloc<int,_unsigned_long,_18446744073709551615UL> local_b0;
  Hasher local_a0;
  Hasher local_94 [12];
  
  Hasher::Hasher(local_94,0);
  Hasher::Hasher(&local_a0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_b0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),in_stack_fffffffffffff950
             ,in_stack_fffffffffffff948,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_b0);
  Hasher::Hasher(local_14c,0);
  Hasher::Hasher(&local_158,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_168,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),in_stack_fffffffffffff950
             ,in_stack_fffffffffffff948,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_168);
  local_16c = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff930,
                    (key_type *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_170 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueKey(in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff930,
                    (key_type *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_174 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9b0,(value_type *)in_stack_fffffffffffff9a8);
  local_1a4 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(in_stack_fffffffffffff9b0,(value_type *)in_stack_fffffffffffff9a8);
  bVar1 = google::
          BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::operator==((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)in_stack_fffffffffffff930,
                       (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                        *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_1e1 = ~bVar1 & 1;
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff930,
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xb4f031)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1e0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (char *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff95c,(char *)in_stack_fffffffffffff950,
               (int)((ulong)in_stack_fffffffffffff948 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff930);
    std::__cxx11::string::~string(local_218);
    testing::Message::~Message((Message *)0xb4f175);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb4f20c);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff930,
              (HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_229 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::operator==((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)in_stack_fffffffffffff930,
                           (BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                            *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)in_stack_fffffffffffff930,
             (bool *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928),(type *)0xb4f26a)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_228);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (in_stack_fffffffffffff9a8,in_stack_fffffffffffff9a0,
               (char *)CONCAT44(in_stack_fffffffffffff99c,in_stack_fffffffffffff998),
               in_stack_fffffffffffff990);
    std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff95c,(char *)in_stack_fffffffffffff950,
               (int)((ulong)in_stack_fffffffffffff948 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_fffffffffffff9b0,(Message *)in_stack_fffffffffffff9a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff930);
    std::__cxx11::string::~string(local_260);
    testing::Message::~Message((Message *)0xb4f33f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb4f3d6);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb4f3e3);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb4f3f0);
  this_01 = (Hasher *)
            ((long)&local_2f8.ht_.rep.settings.
                    super_sh_hashtable_settings<int,_Hasher,_unsigned_long,_4>.super_Hasher + 4);
  uVar4 = 0;
  Hasher::Hasher(this_01,0);
  this_02 = &local_2f8;
  Hasher::Hasher((Hasher *)this_02,uVar4);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_308,uVar4,(int *)(ulong)uVar4);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),in_stack_fffffffffffff950
             ,in_stack_fffffffffffff948,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_308);
  Hasher::Hasher(local_394,0);
  Hasher::Hasher(&local_3a0,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_3b0,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
             CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),in_stack_fffffffffffff950
             ,in_stack_fffffffffffff948,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_3b0);
  local_3b4 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::UniqueObject(in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_02,&this_01->id_);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff930,
              (HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_3f4 = 0;
  local_400 = google::
              BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
              ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                      *)0xb4f55b);
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff948,
             (char *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
             in_stack_fffffffffffff938,(unsigned_long *)in_stack_fffffffffffff930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_3f0);
  if (!bVar1) {
    testing::Message::Message
              ((Message *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960));
    testing::AssertionResult::failure_message((AssertionResult *)0xb4f67d);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(in_stack_fffffffffffff964,in_stack_fffffffffffff960),
               in_stack_fffffffffffff95c,(char *)in_stack_fffffffffffff950,
               (int)((ulong)in_stack_fffffffffffff948 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_02,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff930);
    testing::Message::~Message((Message *)0xb4f6da);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb4f74b);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb4f758);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb4f765);
  uVar4 = 0;
  Hasher::Hasher(local_49c,0);
  Hasher::Hasher(&local_4a8,uVar4);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_4b8,uVar4,(int *)(ulong)uVar4);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(uVar4,in_stack_fffffffffffff960),
             CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),in_stack_fffffffffffff950
             ,in_stack_fffffffffffff948,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_4b8);
  Hasher::Hasher(local_544,0);
  Hasher::Hasher(&local_550,0);
  Alloc<int,_unsigned_long,_18446744073709551615UL>::Alloc(&local_560,0,(int *)0x0);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)CONCAT44(uVar4,in_stack_fffffffffffff960),
             CONCAT44(in_stack_fffffffffffff95c,in_stack_fffffffffffff958),in_stack_fffffffffffff950
             ,in_stack_fffffffffffff948,
             (allocator_type *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
  Alloc<int,_unsigned_long,_18446744073709551615UL>::~Alloc(&local_560);
  kVar2 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey(in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
  local_564 = kVar2;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::set_deleted_key((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                     *)in_stack_fffffffffffff930,
                    (key_type *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  type = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
         ::UniqueObject(in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
  local_568 = type;
  google::
  BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
  ::insert(this_02,&this_01->id_);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::operator=((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)in_stack_fffffffffffff930,
              (HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
               *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  local_5a4 = 1;
  file = (char *)google::
                 BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                 ::size((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)0xb4f8f8);
  local_5b0 = file;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff948,
             (char *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940),
             in_stack_fffffffffffff938,(unsigned_long *)in_stack_fffffffffffff930);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5a0);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar4,kVar2));
    in_stack_fffffffffffff948 =
         (key_equal *)testing::AssertionResult::failure_message((AssertionResult *)0xb4fa1a);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar4,kVar2),type,file,
               (int)((ulong)in_stack_fffffffffffff948 >> 0x20),
               (char *)CONCAT44(in_stack_fffffffffffff944,in_stack_fffffffffffff940));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_02,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffff930);
    testing::Message::~Message((Message *)0xb4fa77);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb4fae8);
  kVar3 = HashtableTest<google::HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
          ::UniqueKey(in_stack_fffffffffffff930,in_stack_fffffffffffff92c);
  lhs = (uint *)google::
                BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                ::count((BaseHashtableInterface<google::dense_hash_set<int,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>_>
                         *)in_stack_fffffffffffff930,
                        (key_type *)CONCAT44(in_stack_fffffffffffff92c,in_stack_fffffffffffff928));
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            ((char *)in_stack_fffffffffffff948,(char *)CONCAT44(kVar3,in_stack_fffffffffffff940),lhs
             ,(unsigned_long *)in_stack_fffffffffffff930);
  line = (int)((ulong)in_stack_fffffffffffff948 >> 0x20);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_5d0);
  if (!bVar1) {
    testing::Message::Message((Message *)CONCAT44(uVar4,kVar2));
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb4fbb2)
    ;
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)CONCAT44(uVar4,kVar2),type,file,line,
               (char *)CONCAT44(kVar3,in_stack_fffffffffffff940));
    testing::internal::AssertHelper::operator=((AssertHelper *)this_02,(Message *)this_01);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xb4fc0f);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb4fc7a);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb4fc87);
  google::
  HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
  ::~HashtableInterface_DenseHashSet
            ((HashtableInterface_DenseHashSet<int,_kEmptyInt,_Hasher,_Hasher,_Alloc<int,_unsigned_long,_18446744073709551615UL>_>
              *)0xb4fc94);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, OperatorEquals) {
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.set_deleted_key(this->UniqueKey(2));

    ht1.insert(this->UniqueObject(10));
    ht2.insert(this->UniqueObject(20));
    EXPECT_FALSE(ht1 == ht2);
    ht1 = ht2;
    EXPECT_TRUE(ht1 == ht2);
  }
  {
    TypeParam ht1, ht2;
    ht1.insert(this->UniqueObject(30));
    ht1 = ht2;
    EXPECT_EQ(0u, ht1.size());
  }
  {
    TypeParam ht1, ht2;
    ht1.set_deleted_key(this->UniqueKey(1));
    ht2.insert(this->UniqueObject(1));  // has same key as ht1.delkey
    ht1 = ht2;                          // should reset deleted-key to 'unset'
    EXPECT_EQ(1u, ht1.size());
    EXPECT_EQ(1u, ht1.count(this->UniqueKey(1)));
  }
}